

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

ostream * lexer::operator<<(ostream *os,Token *token)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  ostream *poVar3;
  int maxTerminalNameLength;
  
  if (json::rules::terminalsNames_abi_cxx11_._24_8_ == 0x129280) {
    maxTerminalNameLength = 0;
  }
  else {
    maxTerminalNameLength = 0;
    p_Var2 = (_Rb_tree_node_base *)json::rules::terminalsNames_abi_cxx11_._24_8_;
    do {
      iVar1 = *(int *)&p_Var2[1]._M_left;
      if (*(int *)&p_Var2[1]._M_left < maxTerminalNameLength) {
        iVar1 = maxTerminalNameLength;
      }
      maxTerminalNameLength = iVar1;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != (_Rb_tree_node_base *)(json::rules::terminalsNames_abi_cxx11_ + 8));
  }
  poVar3 = Token::stringify(token,os,(TerminalNames *)json::rules::terminalsNames_abi_cxx11_,
                            maxTerminalNameLength);
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& os, lexer::Token const& token) {
        int maxNameLength = 0;
        for_each_c(lexer::TerminalNames, json::rules::terminalsNames, terminalName)
            maxNameLength = std::max<int>(maxNameLength, terminalName->second.size());
        return token.stringify(os, json::rules::terminalsNames, maxNameLength);
    }